

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void declare(TidyDocImpl *doc,TidyTagImpl *tags,ctmbstr name,uint versions,uint model,Parser *parser
            ,CheckAttribs *chkattrs)

{
  Dict *local_38;
  Dict *np;
  Parser *parser_local;
  uint model_local;
  uint versions_local;
  ctmbstr name_local;
  TidyTagImpl *tags_local;
  TidyDocImpl *doc_local;
  
  if (name != (ctmbstr)0x0) {
    local_38 = tagsLookup(doc,tags,name);
    if (local_38 == (Dict *)0x0) {
      local_38 = NewDict(doc,name);
      local_38->next = tags->declared_tag_list;
      tags->declared_tag_list = local_38;
    }
    if (local_38->id == TidyTag_UNKNOWN) {
      local_38->versions = versions;
      local_38->model = model | local_38->model;
      local_38->parser = parser;
      local_38->chkattrs = chkattrs;
      local_38->attrvers = (AttrVersion *)0x0;
    }
  }
  return;
}

Assistant:

static void declare( TidyDocImpl* doc, TidyTagImpl* tags,
                     ctmbstr name, uint versions, uint model,
                     Parser *parser, CheckAttribs *chkattrs )
{
    if ( name )
    {
        Dict* np = (Dict*) tagsLookup( doc, tags, name );
        if ( np == NULL )
        {
            np = NewDict( doc, name );
            np->next = tags->declared_tag_list;
            tags->declared_tag_list = np;
        }

        /* Make sure we are not over-writing predefined tags */
        if ( np->id == TidyTag_UNKNOWN )
        {
          np->versions = versions;
          np->model   |= model;
          np->parser   = parser;
          np->chkattrs = chkattrs;
          np->attrvers = NULL;
        }
    }
}